

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-unexpected-read.c
# Opt level: O1

int run_test_tcp_unexpected_read(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  sockaddr_in addr;
  sockaddr_in sStack_18;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_18);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    iVar1 = uv_timer_init(puVar2,&timer_handle);
    if (iVar1 != 0) goto LAB_00171b10;
    iVar1 = uv_timer_start(&timer_handle,timer_cb,1000,0);
    if (iVar1 != 0) goto LAB_00171b15;
    iVar1 = uv_check_init(puVar2,&check_handle);
    if (iVar1 != 0) goto LAB_00171b1a;
    iVar1 = uv_check_start(&check_handle,check_cb);
    if (iVar1 != 0) goto LAB_00171b1f;
    iVar1 = uv_tcp_init(puVar2,&server_handle);
    if (iVar1 != 0) goto LAB_00171b24;
    iVar1 = uv_tcp_init(puVar2,&client_handle);
    if (iVar1 != 0) goto LAB_00171b29;
    iVar1 = uv_tcp_init(puVar2,&peer_handle);
    if (iVar1 != 0) goto LAB_00171b2e;
    iVar1 = uv_tcp_bind(&server_handle,(sockaddr *)&sStack_18,0);
    if (iVar1 != 0) goto LAB_00171b33;
    iVar1 = uv_listen((uv_stream_t *)&server_handle,1,connection_cb);
    if (iVar1 != 0) goto LAB_00171b38;
    iVar1 = uv_tcp_connect(&connect_req,&client_handle,(sockaddr *)&sStack_18,connect_cb);
    if (iVar1 != 0) goto LAB_00171b3d;
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if (iVar1 != 0) goto LAB_00171b42;
    if (ticks < 0x15) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00171b4c;
    }
  }
  else {
    run_test_tcp_unexpected_read_cold_1();
LAB_00171b10:
    run_test_tcp_unexpected_read_cold_2();
LAB_00171b15:
    run_test_tcp_unexpected_read_cold_3();
LAB_00171b1a:
    run_test_tcp_unexpected_read_cold_4();
LAB_00171b1f:
    run_test_tcp_unexpected_read_cold_5();
LAB_00171b24:
    run_test_tcp_unexpected_read_cold_6();
LAB_00171b29:
    run_test_tcp_unexpected_read_cold_7();
LAB_00171b2e:
    run_test_tcp_unexpected_read_cold_8();
LAB_00171b33:
    run_test_tcp_unexpected_read_cold_9();
LAB_00171b38:
    run_test_tcp_unexpected_read_cold_10();
LAB_00171b3d:
    run_test_tcp_unexpected_read_cold_11();
LAB_00171b42:
    run_test_tcp_unexpected_read_cold_12();
  }
  run_test_tcp_unexpected_read_cold_13();
LAB_00171b4c:
  run_test_tcp_unexpected_read_cold_14();
  uv_close((uv_handle_t *)&check_handle,(uv_close_cb)0x0);
  uv_close((uv_handle_t *)&timer_handle,(uv_close_cb)0x0);
  uv_close((uv_handle_t *)&server_handle,(uv_close_cb)0x0);
  uv_close((uv_handle_t *)&client_handle,(uv_close_cb)0x0);
  uv_close((uv_handle_t *)&peer_handle,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(tcp_unexpected_read) {
  struct sockaddr_in addr;
  uv_loop_t* loop;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 1000, 0));
  ASSERT(0 == uv_check_init(loop, &check_handle));
  ASSERT(0 == uv_check_start(&check_handle, check_cb));
  ASSERT(0 == uv_tcp_init(loop, &server_handle));
  ASSERT(0 == uv_tcp_init(loop, &client_handle));
  ASSERT(0 == uv_tcp_init(loop, &peer_handle));
  ASSERT(0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0));
  ASSERT(0 == uv_listen((uv_stream_t*) &server_handle, 1, connection_cb));
  ASSERT(0 == uv_tcp_connect(&connect_req,
                             &client_handle,
                             (const struct sockaddr*) &addr,
                             connect_cb));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  /* This is somewhat inexact but the idea is that the event loop should not
   * start busy looping when the server sends a message and the client isn't
   * reading.
   */
  ASSERT(ticks <= 20);

  MAKE_VALGRIND_HAPPY();
  return 0;
}